

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rumors.c
# Opt level: O2

char * getrumor(int truth,char *rumor_buf,boolean exclude_cookie)

{
  uint *puVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  dlb *dp;
  long lVar5;
  char *pcVar6;
  int iVar7;
  uint uVar8;
  char xbuf [256];
  char line [256];
  undefined1 local_138 [264];
  
  *rumor_buf = '\0';
  if (-1 < true_rumor_size) {
    dp = dlb_fopen("rumors","r");
    if (dp != (dlb *)0x0) {
      uVar8 = 0;
      do {
        *rumor_buf = '\0';
        if (true_rumor_size == 0) {
          dlb_fgets(local_138,0x100,dp);
          dlb_fgets(local_138,0x100,dp);
          iVar2 = __isoc99_sscanf(local_138,"%6x\n",&true_rumor_size);
          if ((iVar2 != 1) || (true_rumor_size < 1)) {
            true_rumor_size = -1;
LAB_002277ff:
            sprintf(rumor_buf,"Error reading \"%.80s\".","rumors");
            return rumor_buf;
          }
          dlb_fseek(dp,0,1);
          lVar5 = dlb_ftell(dp);
          true_rumor_start = (int)lVar5;
          true_rumor_end = true_rumor_start + true_rumor_size;
          dlb_fseek(dp,0,2);
          lVar5 = dlb_ftell(dp);
          false_rumor_start = true_rumor_end;
          false_rumor_size = (int)lVar5 - true_rumor_end;
          if (true_rumor_size < 0) goto LAB_002277ff;
        }
        uVar3 = mt_random();
        uVar4 = (uVar3 & 1) + truth + 1;
        if (3 < uVar4) {
          warning("strange truth value for rumor");
          builtin_strncpy(rumor_buf,"Oops...",8);
          return rumor_buf;
        }
        iVar7 = (uVar3 & 1) + truth;
        puVar1 = (uint *)(&PTR_false_rumor_size_0030b4b0)[uVar4];
        iVar2 = *(int *)(&PTR_false_rumor_start_0030b490)[uVar4];
        uVar3 = mt_random();
        dlb_fseek(dp,(long)(int)(uVar3 % *puVar1) + (long)iVar2,0);
        dlb_fgets(line,0x100,dp);
        pcVar6 = dlb_fgets(line,0x100,dp);
        if ((pcVar6 == (char *)0x0) ||
           ((0 < iVar7 && (lVar5 = dlb_ftell(dp), true_rumor_end < lVar5)))) {
          dlb_fseek(dp,(long)iVar2,0);
          dlb_fgets(line,0x100,dp);
        }
        pcVar6 = strchr(line,10);
        if (pcVar6 != (char *)0x0) {
          *pcVar6 = '\0';
        }
        pcVar6 = xcrypt(line,xbuf);
        strcat(rumor_buf,pcVar6);
        if (((exclude_cookie == '\0') || (0x31 < uVar8)) ||
           ((pcVar6 = strstri(rumor_buf,"fortune"), pcVar6 == (char *)0x0 &&
            (pcVar6 = strstri(rumor_buf,"pity"), pcVar6 == (char *)0x0)))) {
          dlb_fclose(dp);
          if (0x30 < uVar8) {
            warning("Can\'t find non-cookie rumor?");
            return rumor_buf;
          }
          exercise(2,0 < iVar7);
          return rumor_buf;
        }
        uVar8 = uVar8 + 1;
      } while( true );
    }
    pline("Can\'t open rumors file!");
    true_rumor_size = -1;
  }
  return rumor_buf;
}

Assistant:

char *getrumor(int truth, /* 1=true, -1=false, 0=either */
	       char *rumor_buf,
	       boolean exclude_cookie)
{
	dlb	*rumors;
	int tidbit, beginning;
	char	*endp, line[BUFSZ], xbuf[BUFSZ];

	rumor_buf[0] = '\0';
	if (true_rumor_size < 0L)	/* we couldn't open RUMORFILE */
		return rumor_buf;

	rumors = dlb_fopen(RUMORFILE, "r");

	if (rumors) {
	    int count = 0;
	    int adjtruth;

	    do {
		rumor_buf[0] = '\0';
		if (true_rumor_size == 0L) {	/* if this is 1st outrumor() */
		    init_rumors(rumors);
		    if (true_rumor_size < 0L) {	/* init failed */
			sprintf(rumor_buf, "Error reading \"%.80s\".",
				RUMORFILE);
			return rumor_buf;
		    }
		}
		/*
		 *	input:      1    0   -1
		 *	 rn2 \ +1  2=T  1=T  0=F
		 *	 adj./ +0  1=T  0=F -1=F
		 */
		switch (adjtruth = truth + rn2(2)) {
		  case  2:	/*(might let a bogus input arg sneak thru)*/
		  case  1:  beginning = true_rumor_start;
			    tidbit = mt_random() % true_rumor_size;
			break;
		  case  0:	/* once here, 0 => false rather than "either"*/
		  case -1:  beginning = false_rumor_start;
			    tidbit = mt_random() % false_rumor_size;
			break;
		  default:
			    warning("strange truth value for rumor");
			return strcpy(rumor_buf, "Oops...");
		}
		dlb_fseek(rumors, beginning + tidbit, SEEK_SET);
		dlb_fgets(line, sizeof line, rumors);
		if (!dlb_fgets(line, sizeof line, rumors) ||
		    (adjtruth > 0 && dlb_ftell(rumors) > true_rumor_end)) {
			/* reached end of rumors -- go back to beginning */
			dlb_fseek(rumors, beginning, SEEK_SET);
			dlb_fgets(line, sizeof line, rumors);
		}
		if ((endp = strchr(line, '\n')) != 0) *endp = 0;
		strcat(rumor_buf, xcrypt(line, xbuf));
	    } while (count++ < 50 && exclude_cookie && (strstri(rumor_buf, "fortune") || strstri(rumor_buf, "pity")));
	    dlb_fclose(rumors);
	    if (count >= 50)
		warning("Can't find non-cookie rumor?");
	    else
		exercise(A_WIS, (adjtruth > 0));
	} else {
		pline("Can't open rumors file!");
		true_rumor_size = -1;	/* don't try to open it again */
	}
	return rumor_buf;
}